

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_midi.c
# Opt level: O0

void pgmin_list(t_pgmin *x,t_symbol *s,int argc,t_atom *argv)

{
  t_float f;
  t_float f_00;
  t_float channel;
  t_float value;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pgmin *x_local;
  
  f = atom_getfloatarg(0,argc,argv);
  f_00 = atom_getfloatarg(1,argc,argv);
  if ((x->x_channel != 0.0) || (NAN(x->x_channel))) {
    if ((f_00 == x->x_channel) && (!NAN(f_00) && !NAN(x->x_channel))) {
      outlet_float(x->x_outlet1,f);
    }
  }
  else {
    outlet_float(x->x_outlet2,f_00);
    outlet_float(x->x_outlet1,f);
  }
  return;
}

Assistant:

static void pgmin_list(t_pgmin *x, t_symbol *s, int argc, t_atom *argv)
{
    t_float value = atom_getfloatarg(0, argc, argv);
    t_float channel = atom_getfloatarg(1, argc, argv);
    if (x->x_channel != 0)
    {
        if (channel != x->x_channel) return;
        outlet_float(x->x_outlet1, value);
    }
    else
    {
        outlet_float(x->x_outlet2, channel);
        outlet_float(x->x_outlet1, value);
    }
}